

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d64_q1a_card_battle.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  istream *this;
  mapped_type *pmVar2;
  _Self *p_Var3;
  size_type sVar4;
  pointer ppVar5;
  ostream *poVar6;
  iterator __position;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_a8;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_a0;
  _Self local_98;
  _Self local_90;
  iterator used_card;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_80;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_78;
  _Self end;
  int j;
  int t;
  int c;
  int i_1;
  int winnings;
  int local_50;
  int local_4c;
  int tmp;
  int i;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> to_pow;
  int local_10;
  int m;
  int n;
  
  m = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_10);
  std::istream::operator>>
            (this,(int *)((long)&to_pow._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&tmp);
  for (local_4c = 0; local_4c < local_10; local_4c = local_4c + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_50);
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&tmp,&local_50);
    *pmVar2 = *pmVar2 + 1;
  }
  c = 0;
  t = 0;
  do {
    if (to_pow._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ <= t) {
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,c + 1);
      std::operator<<(poVar6,"\n");
      used_card._M_node._4_4_ = 0;
LAB_001015da:
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&tmp)
      ;
      return m;
    }
    std::istream::operator>>((istream *)&std::cin,&j);
    for (end._M_node._0_4_ = 0; (int)end._M_node < j; end._M_node._0_4_ = (int)end._M_node + 1) {
      std::istream::operator>>((istream *)&std::cin,(int *)((long)&end._M_node + 4));
      local_80._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &tmp);
      p_Var3 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator--(&local_80);
      local_78._M_node = p_Var3->_M_node;
      sVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::size
                        ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&tmp);
      if ((sVar4 == 0) ||
         (ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_78),
         ppVar5->first <= end._M_node._4_4_)) {
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,c + 1);
        std::operator<<(poVar6,"\n");
        m = 0;
        used_card._M_node._4_4_ = 1;
        goto LAB_001015da;
      }
      local_90._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           upper_bound((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&tmp,(key_type *)((long)&end._M_node + 4));
      local_98._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &tmp);
      bVar1 = std::operator==(&local_90,&local_98);
      if (bVar1) {
        local_a0._M_node =
             (_Base_ptr)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&tmp);
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_a0);
        ppVar5->second = ppVar5->second + -1;
        local_a8._M_node =
             (_Base_ptr)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&tmp);
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_a8);
        if (ppVar5->second == 0) {
          __position = std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       begin((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&tmp);
          std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
          erase_abi_cxx11_((map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>> *)
                           &tmp,__position);
        }
      }
      else {
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_90);
        ppVar5->second = ppVar5->second + -1;
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_90);
        if (ppVar5->second == 0) {
          std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
          erase_abi_cxx11_((map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>> *)
                           &tmp,(iterator)local_90._M_node);
        }
      }
    }
    c = c + 1;
    t = t + 1;
  } while( true );
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int n, m;
    cin >> n >> m;
    map<int,int> to_pow;
    for (int i = 0; i < n; ++i) {
        // cin >> to_pow[i];
        int tmp;
        cin >> tmp;
        ++to_pow[tmp];
    }
    int winnings = 0;
    for (int i = 0; i < m; ++i) {
        int c,t;
        cin >> c;
        for (int j = 0; j < c; ++j) {
            cin >> t;
            auto end = --to_pow.end();
            if (to_pow.size() == 0 || end->first <= t) {
                cout << winnings + 1 << "\n";
                return 0;
            }
            // auto used_card = upper_bound(to_pow.begin() + new_beg, to_pow.end(), t);
            auto used_card = to_pow.upper_bound(t);
            if (used_card == to_pow.end()) {
                // to_pow.erase(to_pow.begin());
                to_pow.begin()->second--;
                if (to_pow.begin()->second == 0) {
                    to_pow.erase(to_pow.begin());
                }
            } else {
                // to_pow.erase(used_card);
                used_card->second--;
                if (used_card->second == 0) {
                    to_pow.erase(used_card);
                }
            }
        }
        ++winnings;
    }
    cout << winnings + 1 << "\n";
}